

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O1

ColumnConstraintInfo duckdb::CheckConstraints(TableCatalogEntry *table,ColumnDefinition *column)

{
  pointer puVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar6;
  pointer pCVar7;
  NotNullConstraint *pNVar8;
  LogicalIndex LVar9;
  UniqueConstraint *this;
  LogicalIndex LVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  uint3 uVar13;
  int3 iVar14;
  pointer this_00;
  byte local_60;
  string local_50;
  
  pvVar6 = TableCatalogEntry::GetConstraints(table);
  this_00 = (pvVar6->
            super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pvVar6->
           super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 == puVar1) {
    uVar13 = 0;
    local_60 = 0;
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    local_60 = 0;
    uVar13 = 0;
    do {
      pCVar7 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_00);
      if (pCVar7->type == UNIQUE) {
        pCVar7 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_00);
        this = Constraint::Cast<duckdb::UniqueConstraint>(pCVar7);
        bVar4 = UniqueConstraint::IsPrimaryKey(this);
        bVar5 = UniqueConstraint::HasIndex(this);
        if (bVar5) {
          LVar9 = UniqueConstraint::GetIndex(this);
          LVar10 = ColumnDefinition::Logical(column);
          if (LVar9.index == LVar10.index) {
            if (bVar4) {
              iVar14 = 1;
            }
            else {
              local_60 = 1;
            }
          }
        }
        else {
          pvVar11 = UniqueConstraint::GetColumnNames_abi_cxx11_(this);
          pbVar2 = (pvVar11->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = (pvVar11->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ColumnDefinition::GetName_abi_cxx11_(&local_50,column);
          _Var12 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (pbVar2,pbVar3,&local_50);
          pbVar2 = (pvVar11->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (_Var12._M_current != pbVar2) {
            if (bVar4) {
              iVar14 = 1;
            }
            else {
              local_60 = 1;
            }
          }
        }
      }
      else if (pCVar7->type == NOT_NULL) {
        pCVar7 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->(this_00);
        pNVar8 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar7);
        LVar9 = ColumnDefinition::Logical(column);
        if ((pNVar8->index).index == LVar9.index) {
          uVar13 = 1;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  return (ColumnConstraintInfo)(uVar13 | iVar14 << 8 | (uint3)local_60 << 0x10);
}

Assistant:

static ColumnConstraintInfo CheckConstraints(TableCatalogEntry &table, const ColumnDefinition &column) {
	ColumnConstraintInfo result;
	// check all constraints
	for (auto &constraint : table.GetConstraints()) {
		switch (constraint->type) {
		case ConstraintType::NOT_NULL: {
			auto &not_null = constraint->Cast<NotNullConstraint>();
			if (not_null.index == column.Logical()) {
				result.not_null = true;
			}
			break;
		}
		case ConstraintType::UNIQUE: {
			auto &unique = constraint->Cast<UniqueConstraint>();
			bool &constraint_info = unique.IsPrimaryKey() ? result.pk : result.unique;
			if (unique.HasIndex()) {
				if (unique.GetIndex() == column.Logical()) {
					constraint_info = true;
				}
			} else {
				auto &columns = unique.GetColumnNames();
				if (std::find(columns.begin(), columns.end(), column.GetName()) != columns.end()) {
					constraint_info = true;
				}
			}
			break;
		}
		default:
			break;
		}
	}
	return result;
}